

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_meta___tostring(lua_State *L)

{
  ushort uVar1;
  uint uVar2;
  CType *pCVar3;
  uint32_t uVar4;
  int iVar5;
  GCcdata *pGVar6;
  GCstr *pGVar7;
  cTValue *tv;
  GCcdata GVar8;
  uint id;
  uint uVar9;
  int in_ESI;
  ulong uVar10;
  long lVar11;
  CTState *cts;
  GCcdata sp;
  char *fmt;
  TValue *pTVar12;
  
  pGVar6 = ffi_checkcdata(L,in_ESI);
  uVar1 = pGVar6->ctypeid;
  id = (uint)uVar1;
  sp = (GCcdata)(pGVar6 + 1);
  uVar9 = (uint)uVar1;
  GVar8 = sp;
  if (uVar9 == 0x15) {
    id = *(uint *)sp;
    fmt = "ctype<%s>";
    goto LAB_0011dc42;
  }
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  pCVar3 = cts->tab;
  uVar10 = (ulong)uVar9 * 0x10;
  uVar9 = pCVar3[uVar9].info;
  if ((uVar9 & 0xf0800000) == 0x20800000) {
    uVar10 = (ulong)((uVar9 & 0xffff) << 4);
    uVar9 = *(uint *)((long)&pCVar3->info + uVar10);
    GVar8 = *(GCcdata *)sp;
  }
  lVar11 = (long)&pCVar3->info + uVar10;
  if ((uVar9 & 0xf4000000) == 0x34000000) {
    pTVar12 = L->top;
    pGVar7 = lj_ctype_repr_complex(L,(void *)sp,*(CTSize *)(lVar11 + 4));
    uVar4 = (uint32_t)pGVar7;
  }
  else {
    if ((0x3ffffff < uVar9) || (*(int *)(lVar11 + 4) != 8)) {
      uVar2 = uVar9 >> 0x1c;
      if (uVar2 == 2) {
        if (*(int *)(lVar11 + 4) == 4) {
          uVar2 = *(uint *)GVar8;
          GVar8.marked = '\0';
          GVar8.gct = '\0';
          GVar8.ctypeid = 0;
          GVar8.nextgc.gcptr32 = uVar2;
        }
        else {
          GVar8 = *(GCcdata *)GVar8;
        }
        uVar10 = (ulong)((uVar9 & 0xffff) << 4);
        uVar9 = *(uint *)((long)&pCVar3->info + uVar10);
        lVar11 = (long)&pCVar3->info + uVar10;
LAB_0011ddb0:
        fmt = "cdata<%s>: %p";
        if ((((uVar9 & 0xf0000000) == 0x10000000) || ((uVar9 & 0xf8000000) == 0x38000000)) &&
           (tv = lj_ctype_meta(cts,(CTypeID)((ulong)(lVar11 - (long)pCVar3) >> 4),MM_tostring),
           tv != (cTValue *)0x0)) {
          iVar5 = lj_meta_tailcall(L,tv);
          return iVar5;
        }
      }
      else if (uVar2 == 5) {
        uVar9 = *(uint *)GVar8;
        GVar8.marked = '\0';
        GVar8.gct = '\0';
        GVar8.ctypeid = 0;
        GVar8.nextgc.gcptr32 = uVar9;
        fmt = "cdata<%s>: %d";
      }
      else {
        if (uVar2 != 6) goto LAB_0011ddb0;
        GVar8 = *(GCcdata *)GVar8;
        fmt = "cdata<%s>: %p";
      }
LAB_0011dc42:
      pGVar7 = lj_ctype_repr(L,id,(GCstr *)0x0);
      lj_strfmt_pushf(L,fmt,pGVar7 + 1,GVar8);
      goto LAB_0011dd22;
    }
    pTVar12 = L->top;
    pGVar7 = lj_ctype_repr_int64(L,*(uint64_t *)sp,uVar9 & 0x800000);
    uVar4 = (uint32_t)pGVar7;
  }
  pTVar12[-1].u32.lo = uVar4;
  *(undefined4 *)((long)pTVar12 + -4) = 0xfffffffb;
LAB_0011dd22:
  uVar10 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar10 + 0x54) <= *(uint *)(uVar10 + 0x50)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(ffi_meta___tostring)
{
  GCcdata *cd = ffi_checkcdata(L, 1);
  const char *msg = "cdata<%s>: %p";
  CTypeID id = cd->ctypeid;
  void *p = cdataptr(cd);
  if (id == CTID_CTYPEID) {
    msg = "ctype<%s>";
    id = *(CTypeID *)p;
  } else {
    CTState *cts = ctype_cts(L);
    CType *ct = ctype_raw(cts, id);
    if (ctype_isref(ct->info)) {
      p = *(void **)p;
      ct = ctype_rawchild(cts, ct);
    }
    if (ctype_iscomplex(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_complex(L, cdataptr(cd), ct->size));
      goto checkgc;
    } else if (ct->size == 8 && ctype_isinteger(ct->info)) {
      setstrV(L, L->top-1, lj_ctype_repr_int64(L, *(uint64_t *)cdataptr(cd),
					       (ct->info & CTF_UNSIGNED)));
      goto checkgc;
    } else if (ctype_isfunc(ct->info)) {
      p = *(void **)p;
    } else if (ctype_isenum(ct->info)) {
      msg = "cdata<%s>: %d";
      p = (void *)(uintptr_t)*(uint32_t *)p;
    } else {
      if (ctype_isptr(ct->info)) {
	p = cdata_getptr(p, ct->size);
	ct = ctype_rawchild(cts, ct);
      }
      if (ctype_isstruct(ct->info) || ctype_isvector(ct->info)) {
	/* Handle ctype __tostring metamethod. */
	cTValue *tv = lj_ctype_meta(cts, ctype_typeid(cts, ct), MM_tostring);
	if (tv)
	  return lj_meta_tailcall(L, tv);
      }
    }
  }
  lj_strfmt_pushf(L, msg, strdata(lj_ctype_repr(L, id, NULL)), p);
checkgc:
  lj_gc_check(L);
  return 1;
}